

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
TransformPromiseNode<kj::Own<kj::AsyncIoStream>,_kj::_::Void,_kj::CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1955:35),_kj::Own<kj::AsyncCapabilityStream>_>,_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::Own<kj::AsyncIoStream>,_kj::_::Void,_kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_c__:1955:35),_kj::Own<kj::AsyncCapabilityStream>_>,_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  Exception *in;
  ExceptionOr<kj::Own<kj::AsyncIoStream>_> *pEVar1;
  undefined1 local_5e8 [384];
  Void *local_468;
  Void *depValue;
  ExceptionOr<kj::Own<kj::AsyncIoStream>_> local_308;
  Exception *local_198;
  Exception *depException;
  undefined1 local_180 [8];
  ExceptionOr<kj::_::Void> depResult;
  ExceptionOrValue *output_local;
  TransformPromiseNode<kj::Own<kj::AsyncIoStream>,_kj::_::Void,_kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_c__:1955:35),_kj::Own<kj::AsyncCapabilityStream>_>,_kj::_::PropagateException>
  *this_local;
  
  depResult._352_8_ = output;
  ExceptionOr<kj::_::Void>::ExceptionOr((ExceptionOr<kj::_::Void> *)local_180);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_180);
  local_198 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_180);
  if (local_198 == (Exception *)0x0) {
    local_468 = readMaybe<kj::_::Void>
                          ((Maybe<kj::_::Void> *)
                           ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1 + 0x150));
    if (local_468 != (Void *)0x0) {
      mv<kj::_::Void>(local_468);
      MaybeVoidCaller<kj::_::Void,kj::Own<kj::AsyncIoStream>>::
      apply<kj::CaptureByMove<kj::CapabilityStreamNetworkAddress::connect()::__0,kj::Own<kj::AsyncCapabilityStream>>>
                ((CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_c__:1955:35),_kj::Own<kj::AsyncCapabilityStream>_>
                  *)local_5e8,(Void *)&this->func);
      handle((ExceptionOr<kj::Own<kj::AsyncIoStream>_> *)(local_5e8 + 0x10),this,
             (Own<kj::AsyncIoStream> *)local_5e8);
      pEVar1 = ExceptionOrValue::as<kj::Own<kj::AsyncIoStream>>
                         ((ExceptionOrValue *)depResult._352_8_);
      ExceptionOr<kj::Own<kj::AsyncIoStream>_>::operator=
                (pEVar1,(ExceptionOr<kj::Own<kj::AsyncIoStream>_> *)(local_5e8 + 0x10));
      ExceptionOr<kj::Own<kj::AsyncIoStream>_>::~ExceptionOr
                ((ExceptionOr<kj::Own<kj::AsyncIoStream>_> *)(local_5e8 + 0x10));
      Own<kj::AsyncIoStream>::~Own((Own<kj::AsyncIoStream> *)local_5e8);
    }
  }
  else {
    in = mv<kj::Exception>(local_198);
    MaybeVoidCaller<kj::Exception,_kj::_::PropagateException::Bottom>::
    apply<kj::_::PropagateException>((Bottom *)&depValue,(PropagateException *)&this->field_0x38,in)
    ;
    handle(&local_308,this,(Bottom *)&depValue);
    pEVar1 = ExceptionOrValue::as<kj::Own<kj::AsyncIoStream>>((ExceptionOrValue *)depResult._352_8_)
    ;
    ExceptionOr<kj::Own<kj::AsyncIoStream>_>::operator=(pEVar1,&local_308);
    ExceptionOr<kj::Own<kj::AsyncIoStream>_>::~ExceptionOr(&local_308);
    PropagateException::Bottom::~Bottom((Bottom *)&depValue);
  }
  ExceptionOr<kj::_::Void>::~ExceptionOr((ExceptionOr<kj::_::Void> *)local_180);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }